

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsystemtrayicon.cpp
# Opt level: O1

void __thiscall
QSystemTrayIcon::showMessage
          (QSystemTrayIcon *this,QString *title,QString *msg,MessageIcon msgIcon,int msecs)

{
  QSystemTrayIconPrivate *this_00;
  QStyle *pQVar1;
  undefined8 uVar2;
  long in_FS_OFFSET;
  QIcon local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QSystemTrayIconPrivate **)&this->field_0x8;
  if (this_00->visible != true) goto LAB_0038f259;
  switch(msgIcon) {
  case NoIcon:
    QIcon::QIcon(&local_40);
    goto LAB_0038f235;
  case Information:
    uVar2 = 9;
    break;
  case Warning:
    uVar2 = 10;
    break;
  case Critical:
    uVar2 = 0xb;
    break;
  default:
    uVar2 = 0xf0000000;
  }
  pQVar1 = QApplication::style();
  (**(code **)(*(long *)pQVar1 + 0x100))(&local_40,pQVar1,uVar2,0,0);
LAB_0038f235:
  QSystemTrayIconPrivate::showMessage_sys(this_00,title,msg,&local_40,msgIcon,msecs);
  QIcon::~QIcon(&local_40);
LAB_0038f259:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QSystemTrayIcon::showMessage(const QString& title, const QString& msg,
                            QSystemTrayIcon::MessageIcon msgIcon, int msecs)
{
    Q_D(QSystemTrayIcon);
    if (d->visible)
        d->showMessage_sys(title, msg, messageIcon2qIcon(msgIcon), msgIcon, msecs);
}